

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# epd.c
# Opt level: O0

void EpdMultiply2(EpDouble *epd1,EpDouble *epd2)

{
  int iVar1;
  int sign;
  int exponent;
  double value;
  EpDouble *epd2_local;
  EpDouble *epd1_local;
  
  iVar1 = EpdIsNan(epd1);
  if ((iVar1 != 0) || (iVar1 = EpdIsNan(epd2), iVar1 != 0)) {
    EpdMakeNan(epd1);
    return;
  }
  iVar1 = EpdIsInf(epd1);
  if ((iVar1 == 0) && (iVar1 = EpdIsInf(epd2), iVar1 == 0)) {
    if ((SUB84(epd1->type,4) >> 0x14 & 0x7ff) != 0x3ff) {
      __assert_fail("epd1->type.bits.exponent == EPD_MAX_BIN",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/bdd/epd/epd.c"
                    ,0x106,"void EpdMultiply2(EpDouble *, EpDouble *)");
    }
    if ((SUB84(epd2->type,4) >> 0x14 & 0x7ff) == 0x3ff) {
      iVar1 = epd2->exponent;
      (epd1->type).value = (epd1->type).value * (epd2->type).value;
      epd1->exponent = epd1->exponent + iVar1;
      EpdNormalize(epd1);
      return;
    }
    __assert_fail("epd2->type.bits.exponent == EPD_MAX_BIN",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/bdd/epd/epd.c"
                  ,0x107,"void EpdMultiply2(EpDouble *, EpDouble *)");
  }
  EpdMakeInf(epd1,(SUB84(epd1->type,4) ^ SUB84(epd2->type,4)) >> 0x1f);
  return;
}

Assistant:

void
EpdMultiply2(EpDouble *epd1, EpDouble *epd2)
{
  double        value;
  int           exponent;

  if (EpdIsNan(epd1) || EpdIsNan(epd2)) {
    EpdMakeNan(epd1);
    return;
  } else if (EpdIsInf(epd1) || EpdIsInf(epd2)) {
    int sign;

    sign = epd1->type.bits.sign ^ epd2->type.bits.sign;
    EpdMakeInf(epd1, sign);
    return;
  }

  assert(epd1->type.bits.exponent == EPD_MAX_BIN);
  assert(epd2->type.bits.exponent == EPD_MAX_BIN);

  value = epd1->type.value * epd2->type.value;
  exponent = epd1->exponent + epd2->exponent;
  epd1->type.value = value;
  epd1->exponent = exponent;
  EpdNormalize(epd1);
}